

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O1

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  pointer pMVar6;
  Mat *pMVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  int iVar12;
  ulong uVar13;
  float *pfVar14;
  int iVar15;
  long lVar16;
  float *pfVar17;
  int iVar18;
  int iVar19;
  int k;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 in_XMM4 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float local_60;
  float local_5c;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = pMVar6->w;
  uVar2 = pMVar6->h;
  iVar18 = this->image_width;
  iVar19 = this->image_height;
  if (((iVar19 == -0xe9 && iVar18 == -0xe9) &&
       (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pMVar6 == 0x40) &&
     (((this->max_sizes).data == (void *)0x0 ||
      ((long)(this->max_sizes).c * (this->max_sizes).cstep == 0)))) {
    fVar23 = this->step_width;
    fVar25 = this->step_height;
    uVar3 = (this->min_sizes).w;
    uVar5 = (this->aspect_ratios).w;
    iVar18 = uVar3 + uVar5 + -1;
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,iVar1 * uVar2 * iVar18 * 4,4,opt->blob_allocator);
    pvVar8 = pMVar7->data;
    iVar12 = -100;
    if ((pvVar8 != (void *)0x0) && ((long)pMVar7->c * pMVar7->cstep != 0)) {
      if (0 < (int)uVar2) {
        fVar26 = 1.0 / (float)iVar1;
        uVar22 = -(uint)(fVar23 == -233.0);
        fVar23 = (float)(~uVar22 & (uint)fVar23 | uVar22 & (uint)fVar26);
        uVar22 = -(uint)(fVar25 == -233.0);
        fVar27 = (float)(int)uVar2 * 0.5;
        pfVar14 = (float *)(this->min_sizes).data;
        uVar13 = 0;
        do {
          if (0 < iVar1) {
            fVar28 = ((float)(int)uVar13 + this->offset) *
                     (float)(~uVar22 & (uint)fVar25 | (uint)(1.0 / (float)(int)uVar2) & uVar22);
            fVar29 = this->offset * fVar23;
            pfVar17 = (float *)((long)pvVar8 + (long)(iVar18 * iVar1 * 4 * (int)uVar13) * 4);
            pvVar9 = (this->min_sizes).data;
            pvVar10 = (this->aspect_ratios).data;
            iVar19 = 0;
            do {
              if (0 < (int)uVar3) {
                uVar20 = 0;
                do {
                  fVar30 = *(float *)((long)pvVar9 + uVar20 * 4);
                  fVar31 = fVar27 * fVar30 * fVar26;
                  fVar30 = fVar30 * 0.5;
                  *pfVar17 = fVar29 - fVar31;
                  pfVar17[1] = fVar28 - fVar30;
                  pfVar17[2] = fVar29 + fVar31;
                  pfVar17[3] = fVar28 + fVar30;
                  pfVar17 = pfVar17 + 4;
                  uVar20 = uVar20 + 1;
                } while (uVar3 != uVar20);
              }
              if (1 < (int)uVar5) {
                fVar30 = *pfVar14;
                uVar20 = 1;
                do {
                  fVar31 = *(float *)((long)pvVar10 + uVar20 * 4);
                  auVar32 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar31));
                  fVar33 = auVar32._0_4_;
                  fVar24 = fVar31 * fVar33 * fVar33 + -3.0;
                  fVar31 = (float)(~-(uint)(ABS(fVar31) < 1.1754944e-38) &
                                  (uint)(fVar31 * fVar33 * -0.5 * fVar24)) *
                           fVar27 * fVar30 * fVar26;
                  fVar24 = fVar33 * -0.5 * fVar30 * 0.5 * fVar24;
                  *pfVar17 = fVar29 - fVar31;
                  pfVar17[1] = fVar28 - fVar24;
                  pfVar17[2] = fVar29 + fVar31;
                  pfVar17[3] = fVar28 + fVar24;
                  pfVar17 = pfVar17 + 4;
                  uVar20 = uVar20 + 1;
                } while (uVar5 != uVar20);
              }
              fVar29 = fVar29 + fVar23;
              iVar19 = iVar19 + 1;
            } while (iVar19 != iVar1);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar2);
      }
      iVar12 = 0;
      if ((this->clip != 0) && (iVar1 = pMVar7->w, 0 < (long)iVar1)) {
        iVar12 = 0;
        lVar16 = 0;
        do {
          fVar23 = *(float *)((long)pvVar8 + lVar16 * 4);
          if (fVar23 <= 0.0) {
            fVar23 = 0.0;
          }
          if (1.0 <= fVar23) {
            fVar23 = 1.0;
          }
          *(float *)((long)pvVar8 + lVar16 * 4) = fVar23;
          lVar16 = lVar16 + 1;
        } while (iVar1 != lVar16);
      }
    }
  }
  else {
    if (iVar18 == -0xe9) {
      iVar18 = pMVar6[1].w;
    }
    if (iVar19 == -0xe9) {
      iVar19 = pMVar6[1].h;
    }
    fVar23 = this->step_width;
    fVar25 = this->step_height;
    if ((fVar23 == -233.0) &&
       (fVar23 = (float)iVar18 / (float)iVar1, this->step_mmdetection == true)) {
      fVar23 = ceilf(fVar23);
    }
    if ((fVar25 == -233.0) &&
       (fVar25 = (float)iVar19 / (float)(int)uVar2, this->step_mmdetection == true)) {
      fVar25 = ceilf(fVar25);
    }
    uVar3 = (this->min_sizes).w;
    iVar4 = (this->max_sizes).w;
    uVar5 = (this->aspect_ratios).w;
    iVar15 = this->flip;
    if (this->flip != 0) {
      iVar15 = uVar5 * uVar3;
    }
    iVar15 = uVar5 * uVar3 + iVar4 + uVar3 + iVar15;
    pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar7,iVar1 * uVar2 * iVar15 * 4,2,4,opt->blob_allocator);
    pvVar8 = pMVar7->data;
    iVar12 = -100;
    if ((pvVar8 != (void *)0x0) && ((long)pMVar7->c * pMVar7->cstep != 0)) {
      if (0 < (int)uVar2) {
        local_60 = fVar25;
        local_5c = fVar23;
        if (this->center_mmdetection != false) {
          local_60 = fVar25 + -1.0;
          local_5c = fVar23 + -1.0;
        }
        fVar30 = (float)iVar18;
        fVar31 = (float)iVar19;
        auVar32._0_8_ = CONCAT44(fVar31,fVar30);
        auVar32._8_8_ = auVar32._0_8_;
        auVar32 = rcpps(in_XMM4,auVar32);
        fVar26 = auVar32._0_4_;
        fVar27 = auVar32._4_4_;
        fVar28 = auVar32._8_4_;
        fVar29 = auVar32._12_4_;
        fVar26 = (1.0 - fVar30 * fVar26) * fVar26 + fVar26;
        fVar27 = (1.0 - fVar31 * fVar27) * fVar27 + fVar27;
        fVar28 = (1.0 - fVar30 * fVar28) * fVar28 + fVar28;
        fVar29 = (1.0 - fVar31 * fVar29) * fVar29 + fVar29;
        uVar13 = 0;
        do {
          if (0 < iVar1) {
            fVar30 = local_60 * this->offset + (float)(int)uVar13 * fVar25;
            fVar31 = this->offset * local_5c;
            pfVar14 = (float *)((long)pvVar8 + (long)(iVar15 * iVar1 * 4 * (int)uVar13) * 4);
            pvVar9 = (this->min_sizes).data;
            iVar18 = 0;
            do {
              if (0 < (int)uVar3) {
                pvVar10 = (this->max_sizes).data;
                pvVar11 = (this->aspect_ratios).data;
                iVar19 = this->flip;
                uVar20 = 0;
                do {
                  fVar24 = *(float *)((long)pvVar9 + uVar20 * 4);
                  fVar33 = fVar24 * 0.5;
                  *pfVar14 = (fVar31 - fVar33) * fVar26;
                  pfVar14[1] = (fVar30 - fVar33) * fVar27;
                  pfVar14[2] = (fVar33 + fVar31) * fVar28;
                  pfVar14[3] = (fVar33 + fVar30) * fVar29;
                  if (iVar4 < 1) {
                    pfVar14 = pfVar14 + 4;
                  }
                  else {
                    fVar34 = SQRT(*(float *)((long)pvVar10 + uVar20 * 4) * fVar24) * 0.5;
                    pfVar14[4] = (fVar31 - fVar34) * fVar26;
                    pfVar14[5] = (fVar30 - fVar34) * fVar27;
                    pfVar14[6] = (fVar34 + fVar31) * fVar28;
                    pfVar14[7] = (fVar34 + fVar30) * fVar29;
                    pfVar14 = pfVar14 + 8;
                  }
                  if (0 < (int)uVar5) {
                    uVar21 = 0;
                    do {
                      fVar34 = *(float *)((long)pvVar11 + uVar21 * 4);
                      auVar32 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar34));
                      fVar36 = auVar32._0_4_;
                      fVar35 = fVar34 * fVar36 * fVar36 + -3.0;
                      fVar34 = (float)(~-(uint)(ABS(fVar34) < 1.1754944e-38) &
                                      (uint)(fVar34 * fVar36 * -0.5 * fVar35)) * fVar24 * 0.5;
                      fVar35 = fVar36 * -0.5 * fVar33 * fVar35;
                      *pfVar14 = (fVar31 - fVar34) * fVar26;
                      pfVar14[1] = (fVar30 - fVar35) * fVar27;
                      pfVar14[2] = (fVar31 + fVar34) * fVar28;
                      pfVar14[3] = (fVar30 + fVar35) * fVar29;
                      if (iVar19 == 0) {
                        pfVar14 = pfVar14 + 4;
                      }
                      else {
                        pfVar14[4] = (fVar31 - fVar35) * fVar26;
                        pfVar14[5] = (fVar30 - fVar34) * fVar27;
                        pfVar14[6] = (fVar31 + fVar35) * fVar28;
                        pfVar14[7] = (fVar30 + fVar34) * fVar29;
                        pfVar14 = pfVar14 + 8;
                      }
                      uVar21 = uVar21 + 1;
                    } while (uVar5 != uVar21);
                  }
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar3);
              }
              fVar31 = fVar31 + fVar23;
              iVar18 = iVar18 + 1;
            } while (iVar18 != iVar1);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar2);
      }
      if ((this->clip != 0) && (iVar1 = pMVar7->w, 0 < (long)iVar1)) {
        lVar16 = 0;
        do {
          fVar23 = *(float *)((long)pvVar8 + lVar16 * 4);
          if (fVar23 <= 0.0) {
            fVar23 = 0.0;
          }
          if (1.0 <= fVar23) {
            fVar23 = 1.0;
          }
          *(float *)((long)pvVar8 + lVar16 * 4) = fVar23;
          lVar16 = lVar16 + 1;
        } while (iVar1 != lVar16);
      }
      iVar1 = pMVar7->w;
      lVar16 = (long)iVar1;
      iVar18 = iVar1 + 3;
      if (-1 < lVar16) {
        iVar18 = iVar1;
      }
      iVar12 = 0;
      if (3 < lVar16) {
        iVar18 = iVar18 >> 2;
        pfVar14 = (float *)((long)pvVar8 + lVar16 * pMVar7->elemsize);
        do {
          *pfVar14 = this->variances[0];
          pfVar14[1] = this->variances[1];
          pfVar14[2] = this->variances[2];
          pfVar14[3] = this->variances[3];
          pfVar14 = pfVar14 + 4;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
    }
  }
  return iVar12;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = sqrt(aspect_ratios[p]);
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
    {
        step_w = (float)image_w / w;
        if (step_mmdetection)
            step_w = ceil((float)image_w / w);
    }
    if (step_h == -233)
    {
        step_h = (float)image_h / h;
        if (step_mmdetection)
            step_h = ceil((float)image_h / h);
    }

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;
        if (center_mmdetection) 
        {
            center_x = offset * (step_w - 1);
            center_y = offset * (step_h - 1) + i * step_h;
        }

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = sqrt(min_size * max_size);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = min_size * sqrt(ar);
                    box_h = min_size / sqrt(ar);

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}